

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

void __thiscall cfd::core::SigHashType::SetFromSigHashFlag(SigHashType *this,uint8_t flag)

{
  SigHashAlgorithm SVar1;
  SigHashAlgorithm SVar2;
  uint32_t sighash_byte;
  undefined3 in_register_00000031;
  bool bVar3;
  
  bVar3 = (this->kSigHashAnyOneCanPay & flag) != 0;
  SVar1 = ~(uint)this->kSigHashAnyOneCanPay;
  this->is_anyone_can_pay_ = bVar3;
  if (!bVar3) {
    SVar1 = 0xff;
  }
  SVar1 = SVar1 & CONCAT31(in_register_00000031,flag);
  bVar3 = (SVar1 & this->kSigHashForkId) != kSigHashDefault;
  SVar2 = ~(uint)this->kSigHashForkId;
  this->is_fork_id_ = bVar3;
  if (!bVar3) {
    SVar2 = 0xff;
  }
  this->hash_algorithm_ = SVar2 & SVar1;
  return;
}

Assistant:

void SigHashType::SetFromSigHashFlag(uint8_t flag) {
  uint32_t sighash_byte = flag;
  bool is_anyone_can_pay = false;
  bool is_fork_id = false;
  if (sighash_byte & SigHashType::kSigHashAnyOneCanPay) {
    sighash_byte &= ~kSigHashAnyOneCanPay;
    is_anyone_can_pay = true;
  }
  if (sighash_byte & SigHashType::kSigHashForkId) {
    sighash_byte &= ~kSigHashForkId;
    is_fork_id = true;
  }
  hash_algorithm_ = static_cast<SigHashAlgorithm>(sighash_byte);
  is_anyone_can_pay_ = is_anyone_can_pay;
  is_fork_id_ = is_fork_id;
}